

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptExpression(HlslGrammar *this,TIntermTyped **node)

{
  HlslToken *pHVar1;
  bool bVar2;
  bool bVar3;
  TIntermTyped *pTVar4;
  TIntermTyped *rightNode;
  TSourceLoc loc;
  TIntermTyped *local_50;
  TSourceLoc local_48;
  
  *node = (TIntermTyped *)0x0;
  bVar2 = acceptAssignmentExpression(this,node);
  if (bVar2) {
    bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokComma);
    bVar2 = true;
    if (bVar3) {
      pHVar1 = &(this->super_HlslTokenStream).token;
      do {
        local_48.column = (this->super_HlslTokenStream).token.loc.column;
        local_48._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
        local_48.name = (pHVar1->loc).name;
        local_48.string = (this->super_HlslTokenStream).token.loc.string;
        local_48.line = (this->super_HlslTokenStream).token.loc.line;
        HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
        local_50 = (TIntermTyped *)0x0;
        bVar3 = acceptAssignmentExpression(this,&local_50);
        if (bVar3) {
          pTVar4 = TIntermediate::addComma(this->intermediate,*node,local_50,&local_48);
          *node = pTVar4;
          bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokComma);
          bVar2 = (bool)(!bVar3 | bVar2);
        }
        else {
          bVar2 = false;
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2d])(this->parseContext,pHVar1,"Expected","assignment expression","");
          bVar3 = false;
        }
      } while (bVar3 != false);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HlslGrammar::acceptExpression(TIntermTyped*& node)
{
    node = nullptr;

    // assignment_expression
    if (! acceptAssignmentExpression(node))
        return false;

    if (! peekTokenClass(EHTokComma))
        return true;

    do {
        // ... COMMA
        TSourceLoc loc = token.loc;
        advanceToken();

        // ... assignment_expression
        TIntermTyped* rightNode = nullptr;
        if (! acceptAssignmentExpression(rightNode)) {
            expected("assignment expression");
            return false;
        }

        node = intermediate.addComma(node, rightNode, loc);

        if (! peekTokenClass(EHTokComma))
            return true;
    } while (true);
}